

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::f_ftod(Forth *this)

{
  ulong uVar1;
  double dVar2;
  
  requireFStackDepth(this,1,"F>D");
  requireDStackAvailable(this,2,"F>D");
  dVar2 = ForthStack<double>::getTop(&this->fStack);
  ForthStack<double>::pop(&this->fStack);
  uVar1 = (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2;
  ForthStack<unsigned_int>::push(&this->dStack,(uint)uVar1);
  ForthStack<unsigned_int>::push(&this->dStack,(uint)(uVar1 >> 0x20));
  return;
}

Assistant:

void f_ftod(){
			REQUIRE_FSTACK_DEPTH(1, "F>D");
			REQUIRE_DSTACK_AVAILABLE(2, "F>D");
			auto n2 = fStack.getTop(); fStack.pop();
			DCell d1(n2);
			dStack.push(d1.data_.Cells.lo);
			dStack.push(d1.data_.Cells.hi);
		}